

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

double __thiscall
ProbabEstimator::getProbabGtFast1
          (ProbabEstimator *this,double minValInRetained,int numReplaced,int pathLength)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [64];
  double dVar14;
  double dVar15;
  double vals [20];
  double local_b8 [2];
  long alStack_a8 [19];
  
  dVar11 = DistribFunction::getDistrib(this->distribFunction,minValInRetained);
  local_b8[0] = 1.0;
  if (-1 < numReplaced) {
    dVar12 = 1.0;
    uVar3 = 0;
    iVar4 = pathLength;
    do {
      dVar14 = (double)iVar4;
      local_b8[uVar3] = dVar12;
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + -1;
      dVar12 = (dVar12 * dVar14) / (double)(int)uVar3;
    } while (numReplaced + 1 != uVar3);
    if (numReplaced != 0) {
      uVar3 = 1;
      dVar12 = 1.0 - dVar11;
      do {
        dVar14 = dVar12 * local_b8[uVar3];
        dVar12 = dVar12 * (1.0 - dVar11);
        local_b8[uVar3] = dVar14;
        uVar3 = uVar3 + 1;
      } while (numReplaced + 1 != uVar3);
    }
  }
  dVar14 = 1.0;
  dVar12 = 1.0;
  if (pathLength - numReplaced != 0) {
    dVar12 = 1.0;
    uVar5 = pathLength - numReplaced;
    dVar15 = dVar11;
    do {
      dVar1 = dVar15 * dVar12;
      dVar15 = dVar15 * dVar15;
      dVar12 = (double)((ulong)((byte)uVar5 & 1) * (long)dVar1 +
                       (ulong)!(bool)((byte)uVar5 & 1) * (long)dVar12);
      bVar6 = 1 < uVar5;
      uVar5 = (int)uVar5 >> 1;
    } while (bVar6);
  }
  if (-1 < numReplaced) {
    uVar3 = (ulong)(uint)numReplaced;
    do {
      dVar15 = dVar12 * local_b8[uVar3];
      dVar12 = dVar12 * dVar11;
      local_b8[uVar3] = dVar15;
      bVar6 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar6);
    if (-1 < numReplaced) {
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar9 = vpbroadcastq_avx512f();
      uVar3 = 0;
      auVar10 = ZEXT1664(ZEXT816(0x3ff0000000000000));
      do {
        auVar13 = auVar10;
        auVar10 = vpbroadcastq_avx512f();
        auVar10 = vporq_avx512f(auVar10,auVar8);
        uVar2 = vpcmpuq_avx512f(auVar10,auVar9,2);
        auVar10._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * alStack_a8[uVar3 - 1];
        auVar10._0_8_ = (ulong)((byte)uVar2 & 1) * (long)local_b8[uVar3];
        auVar10._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * alStack_a8[uVar3];
        auVar10._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * alStack_a8[uVar3 + 1];
        auVar10._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * alStack_a8[uVar3 + 2];
        auVar10._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * alStack_a8[uVar3 + 3];
        auVar10._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * alStack_a8[uVar3 + 4];
        auVar10._56_8_ = (uVar2 >> 7) * alStack_a8[uVar3 + 5];
        uVar3 = uVar3 + 8;
        auVar10 = vsubpd_avx512f(auVar13,auVar10);
      } while ((numReplaced & 0x7ffffff8U) + 8 != uVar3);
      bVar6 = (bool)((byte)uVar2 & 1);
      auVar8._0_8_ = (ulong)bVar6 * auVar10._0_8_ | (ulong)!bVar6 * auVar13._0_8_;
      bVar6 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar8._8_8_ = (ulong)bVar6 * auVar10._8_8_ | (ulong)!bVar6 * auVar13._8_8_;
      bVar6 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar8._16_8_ = (ulong)bVar6 * auVar10._16_8_ | (ulong)!bVar6 * auVar13._16_8_;
      bVar6 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar8._24_8_ = (ulong)bVar6 * auVar10._24_8_ | (ulong)!bVar6 * auVar13._24_8_;
      bVar6 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar8._32_8_ = (ulong)bVar6 * auVar10._32_8_ | (ulong)!bVar6 * auVar13._32_8_;
      bVar6 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar8._40_8_ = (ulong)bVar6 * auVar10._40_8_ | (ulong)!bVar6 * auVar13._40_8_;
      bVar6 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar8._48_8_ = (ulong)bVar6 * auVar10._48_8_ | (ulong)!bVar6 * auVar13._48_8_;
      auVar8._56_8_ = (uVar2 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar2 >> 7,0) * auVar13._56_8_;
      auVar7 = vextractf64x4_avx512f(auVar8,1);
      auVar10 = vaddpd_avx512f(auVar8,ZEXT3264(auVar7));
      dVar14 = auVar10._0_8_ + auVar10._16_8_ + auVar10._8_8_ + auVar10._24_8_;
    }
  }
  return dVar14;
}

Assistant:

double ProbabEstimator::getProbabGtFast1( const double minValInRetained, const int numReplaced, const int pathLength ){

    double  PAr = distribFunction->getDistrib( minValInRetained );
    double cPAr = 1.0-PAr;
    double vals[20]; vals[0] = 1.0;

    double val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ){ vals[i] = val; val *= (double)(pathLength-i)/(double)(i+1); }
    val = cPAr; 
    for ( int i = 1; i <= numReplaced; ++i ){ vals[i] *= val; val *= cPAr; }
    val = pown( PAr, pathLength-numReplaced );
    for ( int i = numReplaced; i >= 0; --i ){ vals[i] *= val; val *= PAr; }
    val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ) val -= vals[i];
    return val;
}